

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_pbf_writer.hpp
# Opt level: O0

void __thiscall
protozero::basic_pbf_writer<std::__cxx11::string>::
add_bytes_vectored<std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
          (basic_pbf_writer<std::__cxx11::string> *this,pbf_tag_type tag,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *values,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *values_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *values_2)

{
  string *psVar1;
  uint uVar2;
  assert_error *paVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong size;
  char *pcVar7;
  size_t sVar8;
  size_t sum_size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *values_local_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *values_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *values_local;
  pbf_tag_type tag_local;
  basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  if (*(long *)(this + 0x18) != 0) {
    paVar3 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error
              (paVar3,
               "m_pos == 0 && \"you can\'t add fields to a parent basic_pbf_writer if there is an existing basic_pbf_writer for a submessage\""
              );
    __cxa_throw(paVar3,&assert_error::typeinfo,assert_error::~assert_error);
  }
  if (*(long *)this == 0) {
    paVar3 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error(paVar3,"m_data");
    __cxa_throw(paVar3,&assert_error::typeinfo,assert_error::~assert_error);
  }
  lVar4 = std::__cxx11::string::size();
  lVar5 = std::__cxx11::string::size();
  lVar6 = std::__cxx11::string::size();
  size = lVar6 + lVar5 + lVar4;
  uVar2 = Catch::clara::std::numeric_limits<unsigned_int>::max();
  if (uVar2 < size) {
    paVar3 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error(paVar3,"sum_size <= std::numeric_limits<pbf_length_type>::max()");
    __cxa_throw(paVar3,&assert_error::typeinfo,assert_error::~assert_error);
  }
  basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::add_length_varint((basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)this,tag,(pbf_length_type)size);
  buffer_customization<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::reserve_additional(*(string **)this,size);
  psVar1 = *(string **)this;
  pcVar7 = (char *)std::__cxx11::string::data();
  sVar8 = std::__cxx11::string::size();
  buffer_customization<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::append(psVar1,pcVar7,sVar8);
  psVar1 = *(string **)this;
  pcVar7 = (char *)std::__cxx11::string::data();
  sVar8 = std::__cxx11::string::size();
  buffer_customization<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::append(psVar1,pcVar7,sVar8);
  psVar1 = *(string **)this;
  pcVar7 = (char *)std::__cxx11::string::data();
  sVar8 = std::__cxx11::string::size();
  buffer_customization<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::append(psVar1,pcVar7,sVar8);
  return;
}

Assistant:

void add_bytes_vectored(pbf_tag_type tag, Ts&&... values) {
        protozero_assert(m_pos == 0 && "you can't add fields to a parent basic_pbf_writer if there is an existing basic_pbf_writer for a submessage");
        protozero_assert(m_data);
        size_t sum_size = 0;
        (void)std::initializer_list<size_t>{sum_size += values.size()...};
        protozero_assert(sum_size <= std::numeric_limits<pbf_length_type>::max());
        add_length_varint(tag, static_cast<pbf_length_type>(sum_size));
        buffer_customization<TBuffer>::reserve_additional(m_data, sum_size);
        (void)std::initializer_list<int>{(buffer_customization<TBuffer>::append(m_data, values.data(), values.size()), 0)...};
    }